

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

int QStyle::sliderPositionFromValue(int min,int max,int logicalValue,int span,bool upsideDown)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  byte in_R8B;
  uint mod;
  uint div;
  double dpos;
  uint p;
  uint range;
  uint local_38;
  uint local_34;
  uint local_4;
  
  bVar1 = in_R8B & 1;
  if (((int)in_ECX < 1) || (in_ESI <= in_EDI)) {
    local_4 = 0;
  }
  else if (in_EDX < in_EDI) {
    local_34 = in_ECX;
    if (bVar1 == 0) {
      local_34 = 0;
    }
    local_4 = local_34;
  }
  else if (in_ESI < in_EDX) {
    local_38 = in_ECX;
    if (bVar1 != 0) {
      local_38 = 0;
    }
    local_4 = local_38;
  }
  else {
    uVar3 = in_ESI - in_EDI;
    if (bVar1 == 0) {
      uVar4 = in_EDX - in_EDI;
    }
    else {
      uVar4 = in_ESI - in_EDX;
    }
    if (uVar3 < 0x80000) {
      bVar2 = q20::cmp_greater<unsigned_int,int>(0,0x40af70);
      if (bVar2) {
        local_4 = (uVar4 * 2 * in_ECX + uVar3) / (uVar3 * 2);
      }
      else {
        local_4 = uVar4 * (in_ECX / uVar3) + (uVar4 * 2 * (in_ECX % uVar3) + uVar3) / (uVar3 * 2);
      }
    }
    else {
      local_4 = (uint)((double)uVar4 / ((double)uVar3 / (double)(int)in_ECX));
    }
  }
  return local_4;
}

Assistant:

int QStyle::sliderPositionFromValue(int min, int max, int logicalValue, int span, bool upsideDown)
{
    if (span <= 0 || max <= min)
        return 0;
    if (logicalValue < min)
        return upsideDown ? span : 0;
    if (logicalValue > max)
        return upsideDown ? 0 : span;

    const uint range = qint64(max) - min;
    const uint p = upsideDown ? qint64(max) - logicalValue : qint64(logicalValue) - min;

    if (range > (uint)INT_MAX/4096) {
        double dpos = (double(p))/(double(range)/span);
        return int(dpos);
    } else if (q20::cmp_greater(range, span)) {
        return (2 * p * span + range) / (2*range);
    } else {
        uint div = span / range;
        uint mod = span % range;
        return p * div + (2 * p * mod + range) / (2 * range);
    }
    // equiv. to (p * span) / range + 0.5
    // no overflow because of this implicit assumption:
    // span <= 4096
}